

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMAttrMapImpl::setReadOnly(DOMAttrMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  DOMNodeImpl *this_00;
  undefined7 in_register_00000011;
  DOMNode *p;
  XMLSize_t i;
  ulong uVar2;
  
  if (((int)CONCAT71(in_register_00000011,deep) != 0) && (this->fNodes != (DOMNodeVector *)0x0)) {
    XVar1 = this->fNodes->nextFreeSlot;
    for (uVar2 = 0; XVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (uVar2 < this->fNodes->nextFreeSlot) {
        p = this->fNodes->data[uVar2];
      }
      else {
        p = (DOMNode *)0x0;
      }
      this_00 = castToNodeImpl(p);
      DOMNodeImpl::setReadOnly(this_00,readOnl,true);
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep && fNodes!=0)
    {
        XMLSize_t sz = fNodes->size();
        for (XMLSize_t i=0; i<sz; ++i) {
            castToNodeImpl(fNodes->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}